

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void * EvpathReadRemoteMemory
                 (CP_Services Svcs,DP_RS_Stream Stream_v,int Rank,size_t Timestep,size_t Offset,
                 size_t Length,void *Buffer,void *DP_TimestepInfo)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  undefined4 uVar2;
  CManager p_Var3;
  undefined4 *puVar4;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  undefined8 local_48;
  DP_RS_Stream local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  p_Var3 = (*Svcs->getCManager)(*(void **)((long)Stream_v + 8));
  puVar4 = (undefined4 *)malloc(0x48);
  __mutex = (pthread_mutex_t *)((long)Stream_v + 0x18);
  pthread_mutex_lock(__mutex);
  if (EvpathReadRemoteMemory::LastRequestedTimestep != Timestep &&
      EvpathReadRemoteMemory::LastRequestedTimestep != 0xffffffffffffffff) {
    DiscardPriorPreloaded(Svcs,(Evpath_RS_Stream)Stream_v,Timestep);
  }
  EvpathReadRemoteMemory::LastRequestedTimestep = Timestep;
  iVar1 = HandleRequestWithPreloaded
                    (Svcs,(Evpath_RS_Stream)Stream_v,Rank,Timestep,Offset,Length,Buffer);
  *(undefined8 *)(puVar4 + 4) = *(undefined8 *)((long)Stream_v + 8);
  *(DP_RS_Stream *)(puVar4 + 6) = Stream_v;
  puVar4[10] = 0;
  *(CManager *)(puVar4 + 2) = p_Var3;
  *(void **)(puVar4 + 8) = Buffer;
  puVar4[0xb] = Rank;
  *(size_t *)(puVar4 + 0xc) = Offset;
  *(size_t *)(puVar4 + 0xe) = Length;
  *(long *)((long)Stream_v + 0x80) = *(long *)((long)Stream_v + 0x80) + 1;
  if (iVar1 != 0) {
    *puVar4 = 0xffffffff;
    *(long *)((long)Stream_v + 0x88) = *(long *)((long)Stream_v + 0x88) + 1;
    pthread_mutex_unlock(__mutex);
    return puVar4;
  }
  uVar2 = CMCondition_get(p_Var3,0);
  *puVar4 = uVar2;
  *(undefined8 *)(puVar4 + 0x10) = *(undefined8 *)((long)Stream_v + 0x58);
  *(undefined4 **)((long)Stream_v + 0x58) = puVar4;
  CMCondition_set_client_data(p_Var3,uVar2,puVar4);
  pthread_mutex_unlock(__mutex);
  if (*(int *)((long)Stream_v + 0x70) == 2) {
    if (*(ulong *)((long)Stream_v + 0x78) < Timestep) goto LAB_007299f8;
  }
  else if ((*(int *)((long)Stream_v + 0x70) == 1) && (*(ulong *)((long)Stream_v + 0x78) <= Timestep)
          ) {
LAB_007299f8:
    (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                     "Adios waiting for preload data for Timestep %d from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n"
                     ,Timestep,(ulong)(uint)Rank,
                     *(undefined8 *)(*(long *)((long)Stream_v + 0x50) + 8 + (long)Rank * 0x10),
                     DP_TimestepInfo);
    return puVar4;
  }
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                   "Adios requesting to read remote memory for Timestep %d from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n"
                   ,Timestep,(ulong)(uint)Rank,
                   *(undefined8 *)(*(long *)((long)Stream_v + 0x50) + 8 + (long)Rank * 0x10),
                   DP_TimestepInfo);
  local_48 = *(undefined8 *)(*(long *)((long)Stream_v + 0x50) + 8 + (long)Rank * 0x10);
  local_38 = *(undefined4 *)((long)Stream_v + 0x40);
  local_34 = *puVar4;
  local_60 = Timestep;
  local_58 = Offset;
  local_50 = Length;
  local_40 = Stream_v;
  iVar1 = (*Svcs->sendToPeer)(*(void **)((long)Stream_v + 8),
                              *(CP_PeerCohort *)((long)Stream_v + 0x48),Rank,
                              *(CMFormat *)((long)Stream_v + 0x10),&local_60);
  if (iVar1 == 0) {
    puVar4[10] = 1;
    CMCondition_signal(p_Var3,*puVar4);
  }
  return puVar4;
}

Assistant:

static void *EvpathReadRemoteMemory(CP_Services Svcs, DP_RS_Stream Stream_v, int Rank,
                                    size_t Timestep, size_t Offset, size_t Length, void *Buffer,
                                    void *DP_TimestepInfo)
{
    Evpath_RS_Stream Stream =
        (Evpath_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    EvpathCompletionHandle ret = malloc(sizeof(struct _EvpathCompletionHandle));
    // EvpathPerTimestepInfo TimestepInfo =
    // (EvpathPerTimestepInfo)DP_TimestepInfo;
    struct _EvpathReadRequestMsg ReadRequestMsg;

    int HadPreload;
    static size_t LastRequestedTimestep = -1;

    pthread_mutex_lock(&Stream->DataLock);
    if ((LastRequestedTimestep != -1) && (LastRequestedTimestep != Timestep))
    {
        DiscardPriorPreloaded(Svcs, Stream, Timestep);
    }
    LastRequestedTimestep = Timestep;
    HadPreload = HandleRequestWithPreloaded(Svcs, Stream, Rank, Timestep, Offset, Length, Buffer);
    ret->CPStream = Stream->CP_Stream;
    ret->DPStream = Stream;
    ret->Failed = 0;
    ret->cm = cm;
    ret->Buffer = Buffer;
    ret->Rank = Rank;
    ret->Offset = Offset;
    ret->Length = Length;

    Stream->TotalReadRequests++;
    if (HadPreload)
    {
        /* cool, we already had the data.  Setup a dummy return handle */
        ret->CMcondition = -1;
        Stream->ReadRequestsFromPreload++;
        pthread_mutex_unlock(&Stream->DataLock);
        return ret;
    }

    ret->CMcondition = CMCondition_get(cm, NULL);

    /*
     * set the completion handle as client Data on the condition so that
     * handler has access to it.
     */
    AddRequestToList(Svcs, Stream, ret);
    CMCondition_set_client_data(cm, ret->CMcondition, ret);
    pthread_mutex_unlock(&Stream->DataLock);
    int WaitForData = 0;
    switch (Stream->CurPreloadMode)
    {
    case SstPreloadNone:
        break;
    case SstPreloadSpeculative:
        if (Timestep >= Stream->PreloadActiveTimestep)
        {
            WaitForData++;
        }
        break;
    case SstPreloadLearned:
        if (Timestep > Stream->PreloadActiveTimestep)
        {
            WaitForData++;
        }
        break;
    }
    if (WaitForData)
    {
        // we're in some kind of preload mode, but we don't have the data yet,
        // wait for it without sending a request
        Svcs->verbose(Stream->CP_Stream, DPTraceVerbose,
                      "Adios waiting for preload data for Timestep %d "
                      "from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n",
                      Timestep, Rank, Stream->WriterContactInfo[Rank].WS_Stream, DP_TimestepInfo);
        return ret;
    }
    Svcs->verbose(Stream->CP_Stream, DPTraceVerbose,
                  "Adios requesting to read remote memory for Timestep %d "
                  "from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n",
                  Timestep, Rank, Stream->WriterContactInfo[Rank].WS_Stream, DP_TimestepInfo);

    /* send request to appropriate writer */
    /* memset avoids uninit byte warnings from valgrind */
    memset(&ReadRequestMsg, 0, sizeof(ReadRequestMsg));
    ReadRequestMsg.Timestep = Timestep;
    ReadRequestMsg.Offset = Offset;
    ReadRequestMsg.Length = Length;
    ReadRequestMsg.WS_Stream = Stream->WriterContactInfo[Rank].WS_Stream;
    ReadRequestMsg.RS_Stream = Stream;
    ReadRequestMsg.RequestingRank = Stream->Rank;
    ReadRequestMsg.NotifyCondition = ret->CMcondition;
    if (!Svcs->sendToPeer(Stream->CP_Stream, Stream->PeerCohort, Rank, Stream->ReadRequestFormat,
                          &ReadRequestMsg))
    {
        ret->Failed = 1;
        CMCondition_signal(cm, ret->CMcondition);
    }

    return ret;
}